

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

djg_mesh * djgm_load_cap(float angle,int slices,int stacks)

{
  float fVar1;
  float fVar2;
  djg_mesh *pdVar3;
  djgm_vertex *pdVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  float tmp;
  float phi;
  float theta;
  djgm_vertex *v;
  int j;
  int i;
  djg_mesh *mesh;
  int stacks_local;
  int slices_local;
  float angle_local;
  
  pdVar3 = djgm_load_plane(slices,stacks);
  for (v._4_4_ = 0; v._4_4_ < slices + 2; v._4_4_ = v._4_4_ + 1) {
    for (v._0_4_ = 0; (int)v < stacks + 2; v._0_4_ = (int)v + 1) {
      pdVar4 = pdVar3->vertexv + (v._4_4_ * (stacks + 2) + (int)v);
      fVar5 = (pdVar4->st).s * angle;
      fVar2 = (pdVar4->st).t * 2.0 * 3.1415927;
      fVar1 = (pdVar4->st).s;
      (pdVar4->st).s = (pdVar4->st).t;
      (pdVar4->st).t = fVar1;
      (pdVar4->st).p = 0.0;
      (pdVar4->st).q = 0.0;
      dVar6 = std::sin((double)(ulong)(uint)fVar5);
      dVar7 = std::cos((double)(ulong)(uint)fVar2);
      (pdVar4->p).x = SUB84(dVar6,0) * SUB84(dVar7,0);
      dVar6 = std::sin((double)(ulong)(uint)fVar5);
      dVar7 = std::sin((double)(ulong)(uint)fVar2);
      (pdVar4->p).y = SUB84(dVar6,0) * SUB84(dVar7,0);
      dVar6 = std::cos((double)(ulong)(uint)fVar5);
      (pdVar4->p).z = SUB84(dVar6,0);
      dVar6 = std::cos((double)(ulong)(uint)fVar5);
      dVar7 = std::cos((double)(ulong)(uint)fVar2);
      (pdVar4->dpds).x = SUB84(dVar6,0) * SUB84(dVar7,0);
      dVar6 = std::cos((double)(ulong)(uint)fVar5);
      dVar7 = std::sin((double)(ulong)(uint)fVar2);
      (pdVar4->dpds).y = SUB84(dVar6,0) * SUB84(dVar7,0);
      dVar6 = std::sin((double)(ulong)(uint)fVar5);
      (pdVar4->dpds).z = -SUB84(dVar6,0);
      dVar6 = std::sin((double)(ulong)(uint)fVar2);
      (pdVar4->dpdt).x = -SUB84(dVar6,0);
      dVar6 = std::cos((double)(ulong)(uint)fVar2);
      (pdVar4->dpdt).y = SUB84(dVar6,0);
      (pdVar4->dpdt).z = 0.0;
    }
  }
  return pdVar3;
}

Assistant:

DJGDEF djg_mesh *djgm_load_cap(float angle, int slices, int stacks)
{
    djg_mesh *mesh = djgm_load_plane(slices, stacks);
    int i, j;

    slices+= 2;
    stacks+= 2;

    for (i = 0; i < slices; ++i)
    for (j = 0; j < stacks; ++j) {
        djgm_vertex *v = &mesh->vertexv[i * stacks + j];
        float theta = v->st.s * angle;
        float phi = v->st.t * 2.f * M_PI;
        float tmp = v->st.s;

        v->st.s = v->st.t;
        v->st.t = tmp;
        v->st.p = 0;
        v->st.q = 0;

        v->p.x = sin(theta) * cos(phi);
        v->p.y = sin(theta) * sin(phi);
        v->p.z = cos(theta);

        v->dpds.x = cos(theta) * cos(phi);
        v->dpds.y = cos(theta) * sin(phi);
        v->dpds.z = -sin(theta);

        v->dpdt.x = -sin(phi);
        v->dpdt.y = cos(phi);
        v->dpdt.z = 0.f;
    }

    return mesh;
}